

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O3

IShaderResourceVariable * __thiscall
Diligent::ShaderVariableManagerGL::
GetResourceByName<Diligent::ShaderVariableManagerGL::TextureBindInfo>
          (ShaderVariableManagerGL *this,Char *Name)

{
  int iVar1;
  TextureBindInfo *pTVar2;
  PipelineResourceDesc *pPVar3;
  Uint32 ResIndex;
  Uint32 UVar4;
  
  UVar4 = (Uint32)(((ulong)this->m_ImageOffset - (ulong)this->m_TextureOffset) / 0x18);
  if (UVar4 != 0) {
    ResIndex = 0;
    do {
      pTVar2 = GetResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this,ResIndex);
      pPVar3 = GetResourceDesc((pTVar2->
                               super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                               ).
                               super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                               .m_ParentManager,
                               (pTVar2->
                               super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                               ).
                               super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                               .m_ResIndex);
      iVar1 = strcmp(pPVar3->Name,Name);
      if (iVar1 == 0) {
        return (IShaderResourceVariable *)pTVar2;
      }
      ResIndex = ResIndex + 1;
    } while (UVar4 != ResIndex);
  }
  return (IShaderResourceVariable *)0x0;
}

Assistant:

void ShaderVariableManagerGL::UniformBuffBindInfo::SetDynamicOffset(Uint32 ArrayIndex, Uint32 Offset)
{
    const auto& Attr = GetAttribs();
    const auto& Desc = GetDesc();
    VERIFY_EXPR(Desc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER);
#ifdef DILIGENT_DEVELOPMENT
    {
        const auto& CachedUB = m_ParentManager.m_ResourceCache.GetConstUB(Attr.CacheOffset + ArrayIndex);
        VerifyDynamicBufferOffset<BufferGLImpl, BufferViewGLImpl>(Desc, CachedUB.pBuffer, CachedUB.BaseOffset, CachedUB.RangeSize, Offset);
    }
#endif
    m_ParentManager.m_ResourceCache.SetDynamicUBOffset(Attr.CacheOffset + ArrayIndex, Offset);
}